

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::applyResetPragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  size_t sVar1;
  bool bVar2;
  SyntaxNode *this_00;
  Diagnostic *this_01;
  string_view __x;
  SourceRange SVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  const_iterator __begin2;
  
  __begin2.index = 0;
  sVar1 = (pragma->args).elements._M_extent._M_extent_value;
  __begin2.list = &pragma->args;
  for (; (__begin2.list != &pragma->args || (__begin2.index != sVar1 + 1 >> 1));
      __begin2.index = __begin2.index + 1) {
    this_00 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
               iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::dereference(&__begin2)
               ->super_SyntaxNode;
    if ((this_00->kind == SimplePragmaExpression) && ((short)this_00[1].kind == TokenList)) {
      __x = Token::rawText((Token *)(this_00 + 1));
      if (__x._M_len != 0) {
        __y._M_str = "protect";
        __y._M_len = 7;
        bVar2 = std::operator==(__x,__y);
        if (!bVar2) {
          __y_00._M_str = "once";
          __y_00._M_len = 4;
          bVar2 = std::operator==(__x,__y_00);
          if (!bVar2) {
            __y_01._M_str = "diagnostic";
            __y_01._M_len = 10;
            bVar2 = std::operator==(__x,__y_01);
            if (!bVar2) {
              SVar3 = Token::range((Token *)(this_00 + 1));
              this_01 = addDiag(this,(DiagCode)0x2b0004,SVar3);
              Diagnostic::operator<<(this_01,__x);
            }
          }
        }
      }
      __y_02._M_str = "protect";
      __y_02._M_len = 7;
      bVar2 = std::operator==(__x,__y_02);
      if (bVar2) {
        this->protectEncryptDepth = 0;
        this->protectDecryptDepth = 0;
        this->protectLineLength = 0;
        this->protectBytes = 0;
        this->protectEncoding = Raw;
      }
    }
    else {
      SVar3 = slang::syntax::SyntaxNode::sourceRange(this_00);
      addDiag(this,(DiagCode)0x90004,SVar3);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyResetPragma(const PragmaDirectiveSyntax& pragma) {
    // Just check that we know about the names being reset, and warn if we don't.
    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier) {
                std::string_view name = simple.value.rawText();
                if (!name.empty() && name != "protect" && name != "once" && name != "diagnostic")
                    addDiag(diag::UnknownPragma, simple.value.range()) << name;

                if (name == "protect")
                    resetProtectState();

                continue;
            }
        }

        // Otherwise this isn't even a pragma name, so it's ill-formed.
        addDiag(diag::ExpectedPragmaName, arg->sourceRange());
    }
}